

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::detail::ResultBuilder::ResultBuilder
          (ResultBuilder *this,Enum at,char *file,int line,char *expr,char *exception_type,
          String *exception_string)

{
  char *__dest;
  anon_union_24_2_13149d16_for_String_3 local_58;
  undefined1 local_40;
  char *local_38;
  
  if ((exception_string->field_0).buf[0x17] < '\0') {
    local_38 = exception_type;
    __dest = String::allocate((String *)&local_58.data,(exception_string->field_0).data.size);
    memcpy(__dest,(exception_string->field_0).data.ptr,(ulong)(exception_string->field_0).data.size)
    ;
    exception_type = local_38;
  }
  else {
    local_58._16_8_ = *(long *)((long)&exception_string->field_0 + 0x10);
    local_58.data.ptr = (exception_string->field_0).data.ptr;
    local_58._8_8_ = *(undefined8 *)((long)&exception_string->field_0 + 8);
  }
  local_40 = 0;
  AssertData::AssertData
            (&this->super_AssertData,at,file,line,expr,exception_type,
             (StringContains *)&local_58.data);
  if (((long)local_58._16_8_ < 0) && (local_58.data.ptr != (char *)0x0)) {
    operator_delete__(local_58.data.ptr);
  }
  return;
}

Assistant:

ResultBuilder::ResultBuilder(assertType::Enum at, const char* file, int line, const char* expr,
                                 const char* exception_type, const String& exception_string)
        : AssertData(at, file, line, expr, exception_type, exception_string) { }